

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

void ps_hints_t2counter(PS_Hints hints,FT_UInt bit_count,FT_Byte *bytes)

{
  FT_UInt source_bits;
  FT_UInt source_bits_00;
  FT_Memory memory;
  FT_Error FVar1;
  
  if (hints->error != 0) {
    return;
  }
  source_bits = hints->dimension[0].hints.num_hints;
  source_bits_00 = hints->dimension[1].hints.num_hints;
  if (source_bits_00 + source_bits == bit_count) {
    memory = hints->memory;
    FVar1 = ps_dimension_set_mask_bits(hints->dimension,bytes,0,source_bits,0,memory);
    if ((FVar1 == 0) &&
       (FVar1 = ps_dimension_set_mask_bits
                          (hints->dimension + 1,bytes,source_bits,source_bits_00,0,memory),
       FVar1 == 0)) {
      return;
    }
    hints->error = FVar1;
  }
  return;
}

Assistant:

static void
  ps_hints_t2counter( PS_Hints        hints,
                      FT_UInt         bit_count,
                      const FT_Byte*  bytes )
  {
    FT_Error  error;


    if ( !hints->error )
    {
      PS_Dimension  dim    = hints->dimension;
      FT_Memory     memory = hints->memory;
      FT_UInt       count1 = dim[0].hints.num_hints;
      FT_UInt       count2 = dim[1].hints.num_hints;


      /* check bit count, must be equal to current total hint count */
      if ( bit_count !=  count1 + count2 )
      {
        FT_TRACE0(( "ps_hints_t2counter:"
                    " called with invalid bitcount %d (instead of %d)\n",
                   bit_count, count1 + count2 ));

        /* simply ignore the operator */
        return;
      }

      /* set-up new horizontal and vertical hint mask now */
      error = ps_dimension_set_mask_bits( &dim[0], bytes, 0, count1,
                                          0, memory );
      if ( error )
        goto Fail;

      error = ps_dimension_set_mask_bits( &dim[1], bytes, count1, count2,
                                          0, memory );
      if ( error )
        goto Fail;
    }
    return;

  Fail:
    hints->error = error;
  }